

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer_test.cpp
# Opt level: O0

void __thiscall
jsonnet::internal::anon_unknown_0::Lexer_TestKeywords_Test::TestBody(Lexer_TestKeywords_Test *this)

{
  initializer_list<jsonnet::internal::Token> __l;
  initializer_list<jsonnet::internal::Token> __l_00;
  initializer_list<jsonnet::internal::Token> __l_01;
  initializer_list<jsonnet::internal::Token> __l_02;
  initializer_list<jsonnet::internal::Token> __l_03;
  initializer_list<jsonnet::internal::Token> __l_04;
  initializer_list<jsonnet::internal::Token> __l_05;
  initializer_list<jsonnet::internal::Token> __l_06;
  initializer_list<jsonnet::internal::Token> __l_07;
  initializer_list<jsonnet::internal::Token> __l_08;
  initializer_list<jsonnet::internal::Token> __l_09;
  initializer_list<jsonnet::internal::Token> __l_10;
  initializer_list<jsonnet::internal::Token> __l_11;
  initializer_list<jsonnet::internal::Token> __l_12;
  initializer_list<jsonnet::internal::Token> __l_13;
  initializer_list<jsonnet::internal::Token> __l_14;
  initializer_list<jsonnet::internal::Token> __l_15;
  initializer_list<jsonnet::internal::Token> __l_16;
  Token *in_stack_ffffffffffffe340;
  allocator_type *in_stack_ffffffffffffe368;
  string *in_stack_ffffffffffffe370;
  undefined4 in_stack_ffffffffffffe378;
  Kind in_stack_ffffffffffffe37c;
  Token *in_stack_ffffffffffffe380;
  string *in_stack_ffffffffffffe548;
  list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
  *in_stack_ffffffffffffe550;
  char *in_stack_ffffffffffffe558;
  char *in_stack_ffffffffffffe560;
  undefined1 **local_19e8;
  undefined1 **local_19b8;
  undefined1 **local_1988;
  undefined1 **local_1958;
  undefined1 **local_1928;
  undefined1 **local_18f8;
  undefined1 **local_18c8;
  undefined1 **local_1898;
  undefined1 **local_1868;
  undefined1 **local_1838;
  undefined1 **local_1808;
  undefined1 **local_17d8;
  undefined1 **local_17a8;
  undefined1 **local_1778;
  undefined1 **local_1748;
  undefined1 **local_1718;
  undefined1 **local_16e8;
  undefined1 **local_16b8;
  allocator<char> local_1691;
  string local_1690 [38];
  undefined1 local_166a;
  allocator<char> local_1669;
  string local_1668 [32];
  undefined8 *local_1648;
  undefined1 *local_1640 [24];
  undefined8 *local_1580;
  undefined8 local_1578;
  allocator<char> local_1551;
  string local_1550 [38];
  undefined1 local_152a;
  allocator<char> local_1529;
  string local_1528 [32];
  undefined8 *local_1508;
  undefined1 *local_1500 [24];
  undefined8 *local_1440;
  undefined8 local_1438;
  allocator<char> local_1411;
  string local_1410 [38];
  undefined1 local_13ea;
  allocator<char> local_13e9;
  string local_13e8 [32];
  undefined8 *local_13c8;
  undefined1 *local_13c0 [24];
  undefined8 *local_1300;
  undefined8 local_12f8;
  allocator<char> local_12d1;
  string local_12d0 [38];
  undefined1 local_12aa;
  allocator<char> local_12a9;
  string local_12a8 [32];
  undefined8 *local_1288;
  undefined1 *local_1280 [24];
  undefined8 *local_11c0;
  undefined8 local_11b8;
  allocator<char> local_1191;
  string local_1190 [38];
  undefined1 local_116a;
  allocator<char> local_1169;
  string local_1168 [32];
  undefined8 *local_1148;
  undefined1 *local_1140 [24];
  undefined8 *local_1080;
  undefined8 local_1078;
  allocator<char> local_1051;
  string local_1050 [38];
  undefined1 local_102a;
  allocator<char> local_1029;
  string local_1028 [32];
  undefined8 *local_1008;
  undefined1 *local_1000 [24];
  undefined8 *local_f40;
  undefined8 local_f38;
  allocator<char> local_f11;
  string local_f10 [38];
  undefined1 local_eea;
  allocator<char> local_ee9;
  string local_ee8 [32];
  undefined8 *local_ec8;
  undefined1 *local_ec0 [24];
  undefined8 *local_e00;
  undefined8 local_df8;
  allocator<char> local_dd1;
  string local_dd0 [38];
  undefined1 local_daa;
  allocator<char> local_da9;
  string local_da8 [32];
  undefined8 *local_d88;
  undefined1 *local_d80 [24];
  undefined8 *local_cc0;
  undefined8 local_cb8;
  allocator<char> local_c91;
  string local_c90 [38];
  undefined1 local_c6a;
  allocator<char> local_c69;
  string local_c68 [32];
  undefined8 *local_c48;
  undefined1 *local_c40 [24];
  undefined8 *local_b80;
  undefined8 local_b78;
  allocator<char> local_b51;
  string local_b50 [38];
  undefined1 local_b2a;
  allocator<char> local_b29;
  string local_b28 [32];
  undefined8 *local_b08;
  undefined1 *local_b00 [24];
  undefined8 *local_a40;
  undefined8 local_a38;
  allocator<char> local_a11;
  string local_a10 [38];
  undefined1 local_9ea;
  allocator<char> local_9e9;
  string local_9e8 [32];
  undefined8 *local_9c8;
  undefined1 *local_9c0 [24];
  undefined8 *local_900;
  undefined8 local_8f8;
  allocator<char> local_8d1;
  string local_8d0 [38];
  undefined1 local_8aa;
  allocator<char> local_8a9;
  string local_8a8 [32];
  undefined8 *local_888;
  undefined1 *local_880 [24];
  undefined8 *local_7c0;
  undefined8 local_7b8;
  allocator<char> local_791;
  string local_790 [38];
  undefined1 local_76a;
  allocator<char> local_769;
  string local_768 [32];
  undefined8 *local_748;
  undefined1 *local_740 [24];
  undefined8 *local_680;
  undefined8 local_678;
  allocator<char> local_651;
  string local_650 [38];
  undefined1 local_62a;
  allocator<char> local_629;
  string local_628 [32];
  undefined8 *local_608;
  undefined1 *local_600 [24];
  undefined8 *local_540;
  undefined8 local_538;
  allocator<char> local_511;
  string local_510 [38];
  undefined1 local_4ea;
  allocator<char> local_4e9;
  string local_4e8 [32];
  undefined8 *local_4c8;
  undefined1 *local_4c0 [24];
  undefined8 *local_400;
  undefined8 local_3f8;
  allocator<char> local_3d1;
  string local_3d0 [38];
  undefined1 local_3aa;
  allocator<char> local_3a9;
  string local_3a8 [32];
  undefined8 *local_388;
  undefined1 *local_380 [24];
  undefined8 *local_2c0;
  undefined8 local_2b8;
  allocator<char> local_291;
  string local_290 [38];
  undefined1 local_26a;
  allocator<char> local_269;
  string local_268 [32];
  undefined8 *local_248;
  undefined1 *local_240 [24];
  undefined8 *local_180;
  undefined8 local_178;
  allocator<char> local_151;
  string local_150 [35];
  undefined1 local_12d;
  allocator<char> local_119;
  string local_118 [32];
  undefined8 *local_f8;
  undefined1 *local_f0 [24];
  undefined8 *local_30;
  undefined8 local_28;
  
  local_12d = 1;
  local_f8 = local_f0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe380,
             (char *)CONCAT44(in_stack_ffffffffffffe37c,in_stack_ffffffffffffe378),
             (allocator<char> *)in_stack_ffffffffffffe370);
  Token::Token(in_stack_ffffffffffffe380,in_stack_ffffffffffffe37c,in_stack_ffffffffffffe370);
  local_12d = 0;
  local_30 = local_f0;
  local_28 = 1;
  std::allocator<jsonnet::internal::Token>::allocator
            ((allocator<jsonnet::internal::Token> *)0x18162f);
  __l._M_array._4_4_ = in_stack_ffffffffffffe37c;
  __l._M_array._0_4_ = in_stack_ffffffffffffe378;
  __l._M_len = (size_type)in_stack_ffffffffffffe380;
  std::__cxx11::list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>::list
            ((list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_> *)
             in_stack_ffffffffffffe370,__l,in_stack_ffffffffffffe368);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe380,
             (char *)CONCAT44(in_stack_ffffffffffffe37c,in_stack_ffffffffffffe378),
             (allocator<char> *)in_stack_ffffffffffffe370);
  testLex(in_stack_ffffffffffffe560,in_stack_ffffffffffffe558,in_stack_ffffffffffffe550,
          in_stack_ffffffffffffe548);
  std::__cxx11::string::~string(local_150);
  std::allocator<char>::~allocator(&local_151);
  std::__cxx11::list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>::~list
            ((list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_> *)0x1816d1);
  std::allocator<jsonnet::internal::Token>::~allocator
            ((allocator<jsonnet::internal::Token> *)0x1816de);
  local_16b8 = (undefined1 **)&local_30;
  do {
    local_16b8 = local_16b8 + -0x18;
    Token::~Token(in_stack_ffffffffffffe340);
  } while (local_16b8 != local_f0);
  std::__cxx11::string::~string(local_118);
  std::allocator<char>::~allocator(&local_119);
  local_26a = 1;
  local_248 = local_240;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe380,
             (char *)CONCAT44(in_stack_ffffffffffffe37c,in_stack_ffffffffffffe378),
             (allocator<char> *)in_stack_ffffffffffffe370);
  Token::Token(in_stack_ffffffffffffe380,in_stack_ffffffffffffe37c,in_stack_ffffffffffffe370);
  local_26a = 0;
  local_180 = local_240;
  local_178 = 1;
  std::allocator<jsonnet::internal::Token>::allocator
            ((allocator<jsonnet::internal::Token> *)0x1817ef);
  __l_00._M_array._4_4_ = in_stack_ffffffffffffe37c;
  __l_00._M_array._0_4_ = in_stack_ffffffffffffe378;
  __l_00._M_len = (size_type)in_stack_ffffffffffffe380;
  std::__cxx11::list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>::list
            ((list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_> *)
             in_stack_ffffffffffffe370,__l_00,in_stack_ffffffffffffe368);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe380,
             (char *)CONCAT44(in_stack_ffffffffffffe37c,in_stack_ffffffffffffe378),
             (allocator<char> *)in_stack_ffffffffffffe370);
  testLex(in_stack_ffffffffffffe560,in_stack_ffffffffffffe558,in_stack_ffffffffffffe550,
          in_stack_ffffffffffffe548);
  std::__cxx11::string::~string(local_290);
  std::allocator<char>::~allocator(&local_291);
  std::__cxx11::list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>::~list
            ((list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_> *)0x181891);
  std::allocator<jsonnet::internal::Token>::~allocator
            ((allocator<jsonnet::internal::Token> *)0x18189e);
  local_16e8 = (undefined1 **)&local_180;
  do {
    local_16e8 = local_16e8 + -0x18;
    Token::~Token(in_stack_ffffffffffffe340);
  } while (local_16e8 != local_240);
  std::__cxx11::string::~string(local_268);
  std::allocator<char>::~allocator(&local_269);
  local_3aa = 1;
  local_388 = local_380;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe380,
             (char *)CONCAT44(in_stack_ffffffffffffe37c,in_stack_ffffffffffffe378),
             (allocator<char> *)in_stack_ffffffffffffe370);
  Token::Token(in_stack_ffffffffffffe380,in_stack_ffffffffffffe37c,in_stack_ffffffffffffe370);
  local_3aa = 0;
  local_2c0 = local_380;
  local_2b8 = 1;
  std::allocator<jsonnet::internal::Token>::allocator
            ((allocator<jsonnet::internal::Token> *)0x1819af);
  __l_01._M_array._4_4_ = in_stack_ffffffffffffe37c;
  __l_01._M_array._0_4_ = in_stack_ffffffffffffe378;
  __l_01._M_len = (size_type)in_stack_ffffffffffffe380;
  std::__cxx11::list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>::list
            ((list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_> *)
             in_stack_ffffffffffffe370,__l_01,in_stack_ffffffffffffe368);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe380,
             (char *)CONCAT44(in_stack_ffffffffffffe37c,in_stack_ffffffffffffe378),
             (allocator<char> *)in_stack_ffffffffffffe370);
  testLex(in_stack_ffffffffffffe560,in_stack_ffffffffffffe558,in_stack_ffffffffffffe550,
          in_stack_ffffffffffffe548);
  std::__cxx11::string::~string(local_3d0);
  std::allocator<char>::~allocator(&local_3d1);
  std::__cxx11::list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>::~list
            ((list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_> *)0x181a51);
  std::allocator<jsonnet::internal::Token>::~allocator
            ((allocator<jsonnet::internal::Token> *)0x181a5e);
  local_1718 = (undefined1 **)&local_2c0;
  do {
    local_1718 = local_1718 + -0x18;
    Token::~Token(in_stack_ffffffffffffe340);
  } while (local_1718 != local_380);
  std::__cxx11::string::~string(local_3a8);
  std::allocator<char>::~allocator(&local_3a9);
  local_4ea = 1;
  local_4c8 = local_4c0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe380,
             (char *)CONCAT44(in_stack_ffffffffffffe37c,in_stack_ffffffffffffe378),
             (allocator<char> *)in_stack_ffffffffffffe370);
  Token::Token(in_stack_ffffffffffffe380,in_stack_ffffffffffffe37c,in_stack_ffffffffffffe370);
  local_4ea = 0;
  local_400 = local_4c0;
  local_3f8 = 1;
  std::allocator<jsonnet::internal::Token>::allocator
            ((allocator<jsonnet::internal::Token> *)0x181b6f);
  __l_02._M_array._4_4_ = in_stack_ffffffffffffe37c;
  __l_02._M_array._0_4_ = in_stack_ffffffffffffe378;
  __l_02._M_len = (size_type)in_stack_ffffffffffffe380;
  std::__cxx11::list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>::list
            ((list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_> *)
             in_stack_ffffffffffffe370,__l_02,in_stack_ffffffffffffe368);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe380,
             (char *)CONCAT44(in_stack_ffffffffffffe37c,in_stack_ffffffffffffe378),
             (allocator<char> *)in_stack_ffffffffffffe370);
  testLex(in_stack_ffffffffffffe560,in_stack_ffffffffffffe558,in_stack_ffffffffffffe550,
          in_stack_ffffffffffffe548);
  std::__cxx11::string::~string(local_510);
  std::allocator<char>::~allocator(&local_511);
  std::__cxx11::list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>::~list
            ((list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_> *)0x181c11);
  std::allocator<jsonnet::internal::Token>::~allocator
            ((allocator<jsonnet::internal::Token> *)0x181c1e);
  local_1748 = (undefined1 **)&local_400;
  do {
    local_1748 = local_1748 + -0x18;
    Token::~Token(in_stack_ffffffffffffe340);
  } while (local_1748 != local_4c0);
  std::__cxx11::string::~string(local_4e8);
  std::allocator<char>::~allocator(&local_4e9);
  local_62a = 1;
  local_608 = local_600;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe380,
             (char *)CONCAT44(in_stack_ffffffffffffe37c,in_stack_ffffffffffffe378),
             (allocator<char> *)in_stack_ffffffffffffe370);
  Token::Token(in_stack_ffffffffffffe380,in_stack_ffffffffffffe37c,in_stack_ffffffffffffe370);
  local_62a = 0;
  local_540 = local_600;
  local_538 = 1;
  std::allocator<jsonnet::internal::Token>::allocator
            ((allocator<jsonnet::internal::Token> *)0x181d2f);
  __l_03._M_array._4_4_ = in_stack_ffffffffffffe37c;
  __l_03._M_array._0_4_ = in_stack_ffffffffffffe378;
  __l_03._M_len = (size_type)in_stack_ffffffffffffe380;
  std::__cxx11::list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>::list
            ((list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_> *)
             in_stack_ffffffffffffe370,__l_03,in_stack_ffffffffffffe368);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe380,
             (char *)CONCAT44(in_stack_ffffffffffffe37c,in_stack_ffffffffffffe378),
             (allocator<char> *)in_stack_ffffffffffffe370);
  testLex(in_stack_ffffffffffffe560,in_stack_ffffffffffffe558,in_stack_ffffffffffffe550,
          in_stack_ffffffffffffe548);
  std::__cxx11::string::~string(local_650);
  std::allocator<char>::~allocator(&local_651);
  std::__cxx11::list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>::~list
            ((list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_> *)0x181dd1);
  std::allocator<jsonnet::internal::Token>::~allocator
            ((allocator<jsonnet::internal::Token> *)0x181dde);
  local_1778 = (undefined1 **)&local_540;
  do {
    local_1778 = local_1778 + -0x18;
    Token::~Token(in_stack_ffffffffffffe340);
  } while (local_1778 != local_600);
  std::__cxx11::string::~string(local_628);
  std::allocator<char>::~allocator(&local_629);
  local_76a = 1;
  local_748 = local_740;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe380,
             (char *)CONCAT44(in_stack_ffffffffffffe37c,in_stack_ffffffffffffe378),
             (allocator<char> *)in_stack_ffffffffffffe370);
  Token::Token(in_stack_ffffffffffffe380,in_stack_ffffffffffffe37c,in_stack_ffffffffffffe370);
  local_76a = 0;
  local_680 = local_740;
  local_678 = 1;
  std::allocator<jsonnet::internal::Token>::allocator
            ((allocator<jsonnet::internal::Token> *)0x181eef);
  __l_04._M_array._4_4_ = in_stack_ffffffffffffe37c;
  __l_04._M_array._0_4_ = in_stack_ffffffffffffe378;
  __l_04._M_len = (size_type)in_stack_ffffffffffffe380;
  std::__cxx11::list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>::list
            ((list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_> *)
             in_stack_ffffffffffffe370,__l_04,in_stack_ffffffffffffe368);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe380,
             (char *)CONCAT44(in_stack_ffffffffffffe37c,in_stack_ffffffffffffe378),
             (allocator<char> *)in_stack_ffffffffffffe370);
  testLex(in_stack_ffffffffffffe560,in_stack_ffffffffffffe558,in_stack_ffffffffffffe550,
          in_stack_ffffffffffffe548);
  std::__cxx11::string::~string(local_790);
  std::allocator<char>::~allocator(&local_791);
  std::__cxx11::list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>::~list
            ((list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_> *)0x181f91);
  std::allocator<jsonnet::internal::Token>::~allocator
            ((allocator<jsonnet::internal::Token> *)0x181f9e);
  local_17a8 = (undefined1 **)&local_680;
  do {
    local_17a8 = local_17a8 + -0x18;
    Token::~Token(in_stack_ffffffffffffe340);
  } while (local_17a8 != local_740);
  std::__cxx11::string::~string(local_768);
  std::allocator<char>::~allocator(&local_769);
  local_8aa = 1;
  local_888 = local_880;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe380,
             (char *)CONCAT44(in_stack_ffffffffffffe37c,in_stack_ffffffffffffe378),
             (allocator<char> *)in_stack_ffffffffffffe370);
  Token::Token(in_stack_ffffffffffffe380,in_stack_ffffffffffffe37c,in_stack_ffffffffffffe370);
  local_8aa = 0;
  local_7c0 = local_880;
  local_7b8 = 1;
  std::allocator<jsonnet::internal::Token>::allocator
            ((allocator<jsonnet::internal::Token> *)0x1820af);
  __l_05._M_array._4_4_ = in_stack_ffffffffffffe37c;
  __l_05._M_array._0_4_ = in_stack_ffffffffffffe378;
  __l_05._M_len = (size_type)in_stack_ffffffffffffe380;
  std::__cxx11::list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>::list
            ((list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_> *)
             in_stack_ffffffffffffe370,__l_05,in_stack_ffffffffffffe368);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe380,
             (char *)CONCAT44(in_stack_ffffffffffffe37c,in_stack_ffffffffffffe378),
             (allocator<char> *)in_stack_ffffffffffffe370);
  testLex(in_stack_ffffffffffffe560,in_stack_ffffffffffffe558,in_stack_ffffffffffffe550,
          in_stack_ffffffffffffe548);
  std::__cxx11::string::~string(local_8d0);
  std::allocator<char>::~allocator(&local_8d1);
  std::__cxx11::list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>::~list
            ((list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_> *)0x182151);
  std::allocator<jsonnet::internal::Token>::~allocator
            ((allocator<jsonnet::internal::Token> *)0x18215e);
  local_17d8 = (undefined1 **)&local_7c0;
  do {
    local_17d8 = local_17d8 + -0x18;
    Token::~Token(in_stack_ffffffffffffe340);
  } while (local_17d8 != local_880);
  std::__cxx11::string::~string(local_8a8);
  std::allocator<char>::~allocator(&local_8a9);
  local_9ea = 1;
  local_9c8 = local_9c0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe380,
             (char *)CONCAT44(in_stack_ffffffffffffe37c,in_stack_ffffffffffffe378),
             (allocator<char> *)in_stack_ffffffffffffe370);
  Token::Token(in_stack_ffffffffffffe380,in_stack_ffffffffffffe37c,in_stack_ffffffffffffe370);
  local_9ea = 0;
  local_900 = local_9c0;
  local_8f8 = 1;
  std::allocator<jsonnet::internal::Token>::allocator
            ((allocator<jsonnet::internal::Token> *)0x18226f);
  __l_06._M_array._4_4_ = in_stack_ffffffffffffe37c;
  __l_06._M_array._0_4_ = in_stack_ffffffffffffe378;
  __l_06._M_len = (size_type)in_stack_ffffffffffffe380;
  std::__cxx11::list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>::list
            ((list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_> *)
             in_stack_ffffffffffffe370,__l_06,in_stack_ffffffffffffe368);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe380,
             (char *)CONCAT44(in_stack_ffffffffffffe37c,in_stack_ffffffffffffe378),
             (allocator<char> *)in_stack_ffffffffffffe370);
  testLex(in_stack_ffffffffffffe560,in_stack_ffffffffffffe558,in_stack_ffffffffffffe550,
          in_stack_ffffffffffffe548);
  std::__cxx11::string::~string(local_a10);
  std::allocator<char>::~allocator(&local_a11);
  std::__cxx11::list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>::~list
            ((list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_> *)0x182311);
  std::allocator<jsonnet::internal::Token>::~allocator
            ((allocator<jsonnet::internal::Token> *)0x18231e);
  local_1808 = (undefined1 **)&local_900;
  do {
    local_1808 = local_1808 + -0x18;
    Token::~Token(in_stack_ffffffffffffe340);
  } while (local_1808 != local_9c0);
  std::__cxx11::string::~string(local_9e8);
  std::allocator<char>::~allocator(&local_9e9);
  local_b2a = 1;
  local_b08 = local_b00;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe380,
             (char *)CONCAT44(in_stack_ffffffffffffe37c,in_stack_ffffffffffffe378),
             (allocator<char> *)in_stack_ffffffffffffe370);
  Token::Token(in_stack_ffffffffffffe380,in_stack_ffffffffffffe37c,in_stack_ffffffffffffe370);
  local_b2a = 0;
  local_a40 = local_b00;
  local_a38 = 1;
  std::allocator<jsonnet::internal::Token>::allocator
            ((allocator<jsonnet::internal::Token> *)0x18242f);
  __l_07._M_array._4_4_ = in_stack_ffffffffffffe37c;
  __l_07._M_array._0_4_ = in_stack_ffffffffffffe378;
  __l_07._M_len = (size_type)in_stack_ffffffffffffe380;
  std::__cxx11::list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>::list
            ((list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_> *)
             in_stack_ffffffffffffe370,__l_07,in_stack_ffffffffffffe368);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe380,
             (char *)CONCAT44(in_stack_ffffffffffffe37c,in_stack_ffffffffffffe378),
             (allocator<char> *)in_stack_ffffffffffffe370);
  testLex(in_stack_ffffffffffffe560,in_stack_ffffffffffffe558,in_stack_ffffffffffffe550,
          in_stack_ffffffffffffe548);
  std::__cxx11::string::~string(local_b50);
  std::allocator<char>::~allocator(&local_b51);
  std::__cxx11::list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>::~list
            ((list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_> *)0x1824d1);
  std::allocator<jsonnet::internal::Token>::~allocator
            ((allocator<jsonnet::internal::Token> *)0x1824de);
  local_1838 = (undefined1 **)&local_a40;
  do {
    local_1838 = local_1838 + -0x18;
    Token::~Token(in_stack_ffffffffffffe340);
  } while (local_1838 != local_b00);
  std::__cxx11::string::~string(local_b28);
  std::allocator<char>::~allocator(&local_b29);
  local_c6a = 1;
  local_c48 = local_c40;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe380,
             (char *)CONCAT44(in_stack_ffffffffffffe37c,in_stack_ffffffffffffe378),
             (allocator<char> *)in_stack_ffffffffffffe370);
  Token::Token(in_stack_ffffffffffffe380,in_stack_ffffffffffffe37c,in_stack_ffffffffffffe370);
  local_c6a = 0;
  local_b80 = local_c40;
  local_b78 = 1;
  std::allocator<jsonnet::internal::Token>::allocator
            ((allocator<jsonnet::internal::Token> *)0x1825ef);
  __l_08._M_array._4_4_ = in_stack_ffffffffffffe37c;
  __l_08._M_array._0_4_ = in_stack_ffffffffffffe378;
  __l_08._M_len = (size_type)in_stack_ffffffffffffe380;
  std::__cxx11::list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>::list
            ((list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_> *)
             in_stack_ffffffffffffe370,__l_08,in_stack_ffffffffffffe368);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe380,
             (char *)CONCAT44(in_stack_ffffffffffffe37c,in_stack_ffffffffffffe378),
             (allocator<char> *)in_stack_ffffffffffffe370);
  testLex(in_stack_ffffffffffffe560,in_stack_ffffffffffffe558,in_stack_ffffffffffffe550,
          in_stack_ffffffffffffe548);
  std::__cxx11::string::~string(local_c90);
  std::allocator<char>::~allocator(&local_c91);
  std::__cxx11::list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>::~list
            ((list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_> *)0x182691);
  std::allocator<jsonnet::internal::Token>::~allocator
            ((allocator<jsonnet::internal::Token> *)0x18269e);
  local_1868 = (undefined1 **)&local_b80;
  do {
    local_1868 = local_1868 + -0x18;
    Token::~Token(in_stack_ffffffffffffe340);
  } while (local_1868 != local_c40);
  std::__cxx11::string::~string(local_c68);
  std::allocator<char>::~allocator(&local_c69);
  local_daa = 1;
  local_d88 = local_d80;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe380,
             (char *)CONCAT44(in_stack_ffffffffffffe37c,in_stack_ffffffffffffe378),
             (allocator<char> *)in_stack_ffffffffffffe370);
  Token::Token(in_stack_ffffffffffffe380,in_stack_ffffffffffffe37c,in_stack_ffffffffffffe370);
  local_daa = 0;
  local_cc0 = local_d80;
  local_cb8 = 1;
  std::allocator<jsonnet::internal::Token>::allocator
            ((allocator<jsonnet::internal::Token> *)0x1827af);
  __l_09._M_array._4_4_ = in_stack_ffffffffffffe37c;
  __l_09._M_array._0_4_ = in_stack_ffffffffffffe378;
  __l_09._M_len = (size_type)in_stack_ffffffffffffe380;
  std::__cxx11::list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>::list
            ((list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_> *)
             in_stack_ffffffffffffe370,__l_09,in_stack_ffffffffffffe368);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe380,
             (char *)CONCAT44(in_stack_ffffffffffffe37c,in_stack_ffffffffffffe378),
             (allocator<char> *)in_stack_ffffffffffffe370);
  testLex(in_stack_ffffffffffffe560,in_stack_ffffffffffffe558,in_stack_ffffffffffffe550,
          in_stack_ffffffffffffe548);
  std::__cxx11::string::~string(local_dd0);
  std::allocator<char>::~allocator(&local_dd1);
  std::__cxx11::list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>::~list
            ((list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_> *)0x182851);
  std::allocator<jsonnet::internal::Token>::~allocator
            ((allocator<jsonnet::internal::Token> *)0x18285e);
  local_1898 = (undefined1 **)&local_cc0;
  do {
    local_1898 = local_1898 + -0x18;
    Token::~Token(in_stack_ffffffffffffe340);
  } while (local_1898 != local_d80);
  std::__cxx11::string::~string(local_da8);
  std::allocator<char>::~allocator(&local_da9);
  local_eea = 1;
  local_ec8 = local_ec0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe380,
             (char *)CONCAT44(in_stack_ffffffffffffe37c,in_stack_ffffffffffffe378),
             (allocator<char> *)in_stack_ffffffffffffe370);
  Token::Token(in_stack_ffffffffffffe380,in_stack_ffffffffffffe37c,in_stack_ffffffffffffe370);
  local_eea = 0;
  local_e00 = local_ec0;
  local_df8 = 1;
  std::allocator<jsonnet::internal::Token>::allocator
            ((allocator<jsonnet::internal::Token> *)0x18296f);
  __l_10._M_array._4_4_ = in_stack_ffffffffffffe37c;
  __l_10._M_array._0_4_ = in_stack_ffffffffffffe378;
  __l_10._M_len = (size_type)in_stack_ffffffffffffe380;
  std::__cxx11::list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>::list
            ((list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_> *)
             in_stack_ffffffffffffe370,__l_10,in_stack_ffffffffffffe368);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe380,
             (char *)CONCAT44(in_stack_ffffffffffffe37c,in_stack_ffffffffffffe378),
             (allocator<char> *)in_stack_ffffffffffffe370);
  testLex(in_stack_ffffffffffffe560,in_stack_ffffffffffffe558,in_stack_ffffffffffffe550,
          in_stack_ffffffffffffe548);
  std::__cxx11::string::~string(local_f10);
  std::allocator<char>::~allocator(&local_f11);
  std::__cxx11::list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>::~list
            ((list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_> *)0x182a11);
  std::allocator<jsonnet::internal::Token>::~allocator
            ((allocator<jsonnet::internal::Token> *)0x182a1e);
  local_18c8 = (undefined1 **)&local_e00;
  do {
    local_18c8 = local_18c8 + -0x18;
    Token::~Token(in_stack_ffffffffffffe340);
  } while (local_18c8 != local_ec0);
  std::__cxx11::string::~string(local_ee8);
  std::allocator<char>::~allocator(&local_ee9);
  local_102a = 1;
  local_1008 = local_1000;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe380,
             (char *)CONCAT44(in_stack_ffffffffffffe37c,in_stack_ffffffffffffe378),
             (allocator<char> *)in_stack_ffffffffffffe370);
  Token::Token(in_stack_ffffffffffffe380,in_stack_ffffffffffffe37c,in_stack_ffffffffffffe370);
  local_102a = 0;
  local_f40 = local_1000;
  local_f38 = 1;
  std::allocator<jsonnet::internal::Token>::allocator
            ((allocator<jsonnet::internal::Token> *)0x182b2f);
  __l_11._M_array._4_4_ = in_stack_ffffffffffffe37c;
  __l_11._M_array._0_4_ = in_stack_ffffffffffffe378;
  __l_11._M_len = (size_type)in_stack_ffffffffffffe380;
  std::__cxx11::list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>::list
            ((list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_> *)
             in_stack_ffffffffffffe370,__l_11,in_stack_ffffffffffffe368);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe380,
             (char *)CONCAT44(in_stack_ffffffffffffe37c,in_stack_ffffffffffffe378),
             (allocator<char> *)in_stack_ffffffffffffe370);
  testLex(in_stack_ffffffffffffe560,in_stack_ffffffffffffe558,in_stack_ffffffffffffe550,
          in_stack_ffffffffffffe548);
  std::__cxx11::string::~string(local_1050);
  std::allocator<char>::~allocator(&local_1051);
  std::__cxx11::list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>::~list
            ((list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_> *)0x182bd1);
  std::allocator<jsonnet::internal::Token>::~allocator
            ((allocator<jsonnet::internal::Token> *)0x182bde);
  local_18f8 = (undefined1 **)&local_f40;
  do {
    local_18f8 = local_18f8 + -0x18;
    Token::~Token(in_stack_ffffffffffffe340);
  } while (local_18f8 != local_1000);
  std::__cxx11::string::~string(local_1028);
  std::allocator<char>::~allocator(&local_1029);
  local_116a = 1;
  local_1148 = local_1140;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe380,
             (char *)CONCAT44(in_stack_ffffffffffffe37c,in_stack_ffffffffffffe378),
             (allocator<char> *)in_stack_ffffffffffffe370);
  Token::Token(in_stack_ffffffffffffe380,in_stack_ffffffffffffe37c,in_stack_ffffffffffffe370);
  local_116a = 0;
  local_1080 = local_1140;
  local_1078 = 1;
  std::allocator<jsonnet::internal::Token>::allocator
            ((allocator<jsonnet::internal::Token> *)0x182cef);
  __l_12._M_array._4_4_ = in_stack_ffffffffffffe37c;
  __l_12._M_array._0_4_ = in_stack_ffffffffffffe378;
  __l_12._M_len = (size_type)in_stack_ffffffffffffe380;
  std::__cxx11::list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>::list
            ((list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_> *)
             in_stack_ffffffffffffe370,__l_12,in_stack_ffffffffffffe368);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe380,
             (char *)CONCAT44(in_stack_ffffffffffffe37c,in_stack_ffffffffffffe378),
             (allocator<char> *)in_stack_ffffffffffffe370);
  testLex(in_stack_ffffffffffffe560,in_stack_ffffffffffffe558,in_stack_ffffffffffffe550,
          in_stack_ffffffffffffe548);
  std::__cxx11::string::~string(local_1190);
  std::allocator<char>::~allocator(&local_1191);
  std::__cxx11::list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>::~list
            ((list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_> *)0x182d91);
  std::allocator<jsonnet::internal::Token>::~allocator
            ((allocator<jsonnet::internal::Token> *)0x182d9e);
  local_1928 = (undefined1 **)&local_1080;
  do {
    local_1928 = local_1928 + -0x18;
    Token::~Token(in_stack_ffffffffffffe340);
  } while (local_1928 != local_1140);
  std::__cxx11::string::~string(local_1168);
  std::allocator<char>::~allocator(&local_1169);
  local_12aa = 1;
  local_1288 = local_1280;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe380,
             (char *)CONCAT44(in_stack_ffffffffffffe37c,in_stack_ffffffffffffe378),
             (allocator<char> *)in_stack_ffffffffffffe370);
  Token::Token(in_stack_ffffffffffffe380,in_stack_ffffffffffffe37c,in_stack_ffffffffffffe370);
  local_12aa = 0;
  local_11c0 = local_1280;
  local_11b8 = 1;
  std::allocator<jsonnet::internal::Token>::allocator
            ((allocator<jsonnet::internal::Token> *)0x182eaf);
  __l_13._M_array._4_4_ = in_stack_ffffffffffffe37c;
  __l_13._M_array._0_4_ = in_stack_ffffffffffffe378;
  __l_13._M_len = (size_type)in_stack_ffffffffffffe380;
  std::__cxx11::list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>::list
            ((list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_> *)
             in_stack_ffffffffffffe370,__l_13,in_stack_ffffffffffffe368);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe380,
             (char *)CONCAT44(in_stack_ffffffffffffe37c,in_stack_ffffffffffffe378),
             (allocator<char> *)in_stack_ffffffffffffe370);
  testLex(in_stack_ffffffffffffe560,in_stack_ffffffffffffe558,in_stack_ffffffffffffe550,
          in_stack_ffffffffffffe548);
  std::__cxx11::string::~string(local_12d0);
  std::allocator<char>::~allocator(&local_12d1);
  std::__cxx11::list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>::~list
            ((list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_> *)0x182f51);
  std::allocator<jsonnet::internal::Token>::~allocator
            ((allocator<jsonnet::internal::Token> *)0x182f5e);
  local_1958 = (undefined1 **)&local_11c0;
  do {
    local_1958 = local_1958 + -0x18;
    Token::~Token(in_stack_ffffffffffffe340);
  } while (local_1958 != local_1280);
  std::__cxx11::string::~string(local_12a8);
  std::allocator<char>::~allocator(&local_12a9);
  local_13ea = 1;
  local_13c8 = local_13c0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe380,
             (char *)CONCAT44(in_stack_ffffffffffffe37c,in_stack_ffffffffffffe378),
             (allocator<char> *)in_stack_ffffffffffffe370);
  Token::Token(in_stack_ffffffffffffe380,in_stack_ffffffffffffe37c,in_stack_ffffffffffffe370);
  local_13ea = 0;
  local_1300 = local_13c0;
  local_12f8 = 1;
  std::allocator<jsonnet::internal::Token>::allocator
            ((allocator<jsonnet::internal::Token> *)0x18306f);
  __l_14._M_array._4_4_ = in_stack_ffffffffffffe37c;
  __l_14._M_array._0_4_ = in_stack_ffffffffffffe378;
  __l_14._M_len = (size_type)in_stack_ffffffffffffe380;
  std::__cxx11::list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>::list
            ((list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_> *)
             in_stack_ffffffffffffe370,__l_14,in_stack_ffffffffffffe368);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe380,
             (char *)CONCAT44(in_stack_ffffffffffffe37c,in_stack_ffffffffffffe378),
             (allocator<char> *)in_stack_ffffffffffffe370);
  testLex(in_stack_ffffffffffffe560,in_stack_ffffffffffffe558,in_stack_ffffffffffffe550,
          in_stack_ffffffffffffe548);
  std::__cxx11::string::~string(local_1410);
  std::allocator<char>::~allocator(&local_1411);
  std::__cxx11::list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>::~list
            ((list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_> *)0x183111);
  std::allocator<jsonnet::internal::Token>::~allocator
            ((allocator<jsonnet::internal::Token> *)0x18311e);
  local_1988 = (undefined1 **)&local_1300;
  do {
    local_1988 = local_1988 + -0x18;
    Token::~Token(in_stack_ffffffffffffe340);
  } while (local_1988 != local_13c0);
  std::__cxx11::string::~string(local_13e8);
  std::allocator<char>::~allocator(&local_13e9);
  local_152a = 1;
  local_1508 = local_1500;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe380,
             (char *)CONCAT44(in_stack_ffffffffffffe37c,in_stack_ffffffffffffe378),
             (allocator<char> *)in_stack_ffffffffffffe370);
  Token::Token(in_stack_ffffffffffffe380,in_stack_ffffffffffffe37c,in_stack_ffffffffffffe370);
  local_152a = 0;
  local_1440 = local_1500;
  local_1438 = 1;
  std::allocator<jsonnet::internal::Token>::allocator
            ((allocator<jsonnet::internal::Token> *)0x18322f);
  __l_15._M_array._4_4_ = in_stack_ffffffffffffe37c;
  __l_15._M_array._0_4_ = in_stack_ffffffffffffe378;
  __l_15._M_len = (size_type)in_stack_ffffffffffffe380;
  std::__cxx11::list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>::list
            ((list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_> *)
             in_stack_ffffffffffffe370,__l_15,in_stack_ffffffffffffe368);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe380,
             (char *)CONCAT44(in_stack_ffffffffffffe37c,in_stack_ffffffffffffe378),
             (allocator<char> *)in_stack_ffffffffffffe370);
  testLex(in_stack_ffffffffffffe560,in_stack_ffffffffffffe558,in_stack_ffffffffffffe550,
          in_stack_ffffffffffffe548);
  std::__cxx11::string::~string(local_1550);
  std::allocator<char>::~allocator(&local_1551);
  std::__cxx11::list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>::~list
            ((list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_> *)0x1832d1);
  std::allocator<jsonnet::internal::Token>::~allocator
            ((allocator<jsonnet::internal::Token> *)0x1832de);
  local_19b8 = (undefined1 **)&local_1440;
  do {
    local_19b8 = local_19b8 + -0x18;
    Token::~Token(in_stack_ffffffffffffe340);
  } while (local_19b8 != local_1500);
  std::__cxx11::string::~string(local_1528);
  std::allocator<char>::~allocator(&local_1529);
  local_166a = 1;
  local_1648 = local_1640;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe380,
             (char *)CONCAT44(in_stack_ffffffffffffe37c,in_stack_ffffffffffffe378),
             (allocator<char> *)in_stack_ffffffffffffe370);
  Token::Token(in_stack_ffffffffffffe380,in_stack_ffffffffffffe37c,in_stack_ffffffffffffe370);
  local_166a = 0;
  local_1580 = local_1640;
  local_1578 = 1;
  std::allocator<jsonnet::internal::Token>::allocator
            ((allocator<jsonnet::internal::Token> *)0x1833ef);
  __l_16._M_array._4_4_ = in_stack_ffffffffffffe37c;
  __l_16._M_array._0_4_ = in_stack_ffffffffffffe378;
  __l_16._M_len = (size_type)in_stack_ffffffffffffe380;
  std::__cxx11::list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>::list
            ((list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_> *)
             in_stack_ffffffffffffe370,__l_16,in_stack_ffffffffffffe368);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe380,
             (char *)CONCAT44(in_stack_ffffffffffffe37c,in_stack_ffffffffffffe378),
             (allocator<char> *)in_stack_ffffffffffffe370);
  testLex(in_stack_ffffffffffffe560,in_stack_ffffffffffffe558,in_stack_ffffffffffffe550,
          in_stack_ffffffffffffe548);
  std::__cxx11::string::~string(local_1690);
  std::allocator<char>::~allocator(&local_1691);
  std::__cxx11::list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>::~list
            ((list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_> *)0x183491);
  std::allocator<jsonnet::internal::Token>::~allocator
            ((allocator<jsonnet::internal::Token> *)0x18349e);
  local_19e8 = (undefined1 **)&local_1580;
  do {
    local_19e8 = local_19e8 + -0x18;
    Token::~Token(in_stack_ffffffffffffe340);
  } while (local_19e8 != local_1640);
  std::__cxx11::string::~string(local_1668);
  std::allocator<char>::~allocator(&local_1669);
  return;
}

Assistant:

TEST(Lexer, TestKeywords)
{
    testLex("assert", "assert", {Token(Token::Kind::ASSERT, "assert")}, "");
    testLex("else", "else", {Token(Token::Kind::ELSE, "else")}, "");
    testLex("error", "error", {Token(Token::Kind::ERROR, "error")}, "");
    testLex("false", "false", {Token(Token::Kind::FALSE, "false")}, "");
    testLex("for", "for", {Token(Token::Kind::FOR, "for")}, "");
    testLex("function", "function", {Token(Token::Kind::FUNCTION, "function")}, "");
    testLex("if", "if", {Token(Token::Kind::IF, "if")}, "");
    testLex("import", "import", {Token(Token::Kind::IMPORT, "import")}, "");
    testLex("importstr", "importstr", {Token(Token::Kind::IMPORTSTR, "importstr")}, "");
    testLex("importbin", "importbin", {Token(Token::Kind::IMPORTBIN, "importbin")}, "");
    testLex("in", "in", {Token(Token::Kind::IN, "in")}, "");
    testLex("local", "local", {Token(Token::Kind::LOCAL, "local")}, "");
    testLex("null", "null", {Token(Token::Kind::NULL_LIT, "null")}, "");
    testLex("self", "self", {Token(Token::Kind::SELF, "self")}, "");
    testLex("super", "super", {Token(Token::Kind::SUPER, "super")}, "");
    testLex("tailstrict", "tailstrict", {Token(Token::Kind::TAILSTRICT, "tailstrict")}, "");
    testLex("then", "then", {Token(Token::Kind::THEN, "then")}, "");
    testLex("true", "true", {Token(Token::Kind::TRUE, "true")}, "");
}